

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_scale_test.cc
# Opt level: O0

void anon_unknown.dwarf_168b90f::FillEdge<unsigned_char>
               (ACMRandom *rnd,int num_pixels,int bd,bool trash,uchar *data)

{
  uint16_t uVar1;
  byte in_CL;
  byte in_DL;
  int in_ESI;
  ACMRandom *in_R8;
  int i;
  uchar mask;
  int local_28;
  
  if ((in_CL & 1) == 0) {
    memset(in_R8,0,(long)in_ESI);
  }
  else {
    for (local_28 = 0; local_28 < in_ESI; local_28 = local_28 + 1) {
      uVar1 = libaom_test::ACMRandom::Rand16(in_R8);
      *(byte *)((long)&(in_R8->random_).state_ + (long)local_28) =
           (byte)uVar1 & (char)(1 << (in_DL & 0x1f)) - 1U;
    }
  }
  return;
}

Assistant:

void FillEdge(ACMRandom *rnd, int num_pixels, int bd, bool trash, Pixel *data) {
  if (!trash) {
    memset(data, 0, sizeof(*data) * num_pixels);
    return;
  }
  const Pixel mask = (1 << bd) - 1;
  for (int i = 0; i < num_pixels; ++i) data[i] = rnd->Rand16() & mask;
}